

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool skipheader;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  sigaction sa;
  
  skipheader = false;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"vhs");
      if (iVar1 == -1) {
        progname = *argv;
        memset(&sa,0,0x98);
        sigemptyset((sigset_t *)&sa.sa_mask);
        sa.__sigaction_handler.sa_handler = segfault_sigaction;
        sa.sa_flags = 4;
        sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
        std::__cxx11::string::string((string *)&local_d8,"",&local_f9);
        std::__cxx11::string::string((string *)&local_f8,"",&local_fa);
        initstreams(&local_d8,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_d8);
        fmprogrammetocsv::doit(skipheader);
        return 0;
      }
      if (iVar1 != 0x73) break;
      skipheader = true;
    }
    if (iVar1 == 0x68) break;
    if (iVar1 == 0x76) {
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
LAB_00101489:
      exit(1);
    }
  }
  help();
  goto LAB_00101489;
}

Assistant:

int main(int argc, char *argv[]) {
    int opt;
    bool skipheader = false;
    while ((opt = getopt(argc, argv, "vhs")) != -1) {
        switch (opt) {
        case 's':
            skipheader = true;
            break;
        case 'v':
            fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
            exit(EXIT_FAILURE);
            break;
        case 'h':
            help();
            exit(EXIT_FAILURE);
        }
    }

    progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
    struct sigaction sa;

    memset(&sa, 0, sizeof(struct sigaction));
    sigemptyset(&sa.sa_mask);
    sa.sa_sigaction = segfault_sigaction;
    sa.sa_flags = SA_SIGINFO;

    sigaction(SIGSEGV, &sa, NULL);
#endif
    try {
        initstreams();
        fmprogrammetocsv::doit(skipheader);
    } catch (std::bad_alloc&) {
        fprintf(stderr, "%s: Memory allocation failed\n", progname);
        exit(EXIT_FAILURE);
    }
    return EXIT_SUCCESS;
}